

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,size_t i)

{
  float fVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  byte bVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  ulong uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined4 uVar58;
  undefined1 auVar59 [64];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined4 uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  
  pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar2 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar4 = (pBVar3->super_RawBufferView).ptr_ofs;
  sVar5 = (pBVar3->super_RawBufferView).stride;
  lVar21 = sVar5 * uVar2;
  auVar57 = *(undefined1 (*) [16])(pcVar4 + lVar21);
  lVar16 = sVar5 * (uVar2 + 1);
  auVar27 = *(undefined1 (*) [16])(pcVar4 + lVar16);
  pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar6 = (pBVar3->super_RawBufferView).ptr_ofs;
  sVar5 = (pBVar3->super_RawBufferView).stride;
  lVar18 = uVar2 * sVar5;
  lVar19 = sVar5 * (uVar2 + 1);
  fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar9 = fVar1 * *(float *)(pcVar4 + lVar21 + 0xc);
  auVar28 = vinsertps_avx(auVar57,ZEXT416((uint)fVar9),0x30);
  fVar10 = fVar1 * *(float *)(pcVar4 + lVar16 + 0xc);
  auVar56 = vinsertps_avx(auVar27,ZEXT416((uint)fVar10),0x30);
  auVar31 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar18),
                          ZEXT416((uint)(fVar1 * *(float *)(pcVar6 + lVar18 + 0xc))),0x30);
  auVar61 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar19),
                          ZEXT416((uint)(fVar1 * *(float *)(pcVar6 + lVar19 + 0xc))),0x30);
  auVar29._8_4_ = 0xbeaaaaab;
  auVar29._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar29._12_4_ = 0xbeaaaaab;
  auVar31 = vfnmadd213ps_fma(auVar31,auVar29,auVar28);
  auVar28 = vfmadd213ps_fma(auVar61,auVar29,auVar56);
  uVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar17 = (ulong)uVar2;
  uVar58 = auVar57._0_4_;
  uVar64 = auVar31._0_4_;
  if (uVar17 == 4) {
    auVar62._4_4_ = uVar58;
    auVar62._0_4_ = uVar58;
    auVar62._8_4_ = uVar58;
    auVar62._12_4_ = uVar58;
    auVar61 = vshufps_avx(auVar57,auVar57,0x55);
    auVar57 = vshufps_avx(auVar57,auVar57,0xaa);
    auVar65._4_4_ = fVar9;
    auVar65._0_4_ = fVar9;
    auVar65._8_4_ = fVar9;
    auVar65._12_4_ = fVar9;
    auVar67._4_4_ = uVar64;
    auVar67._0_4_ = uVar64;
    auVar67._8_4_ = uVar64;
    auVar67._12_4_ = uVar64;
    auVar29 = vshufps_avx(auVar31,auVar31,0x55);
    auVar30 = vshufps_avx(auVar31,auVar31,0xaa);
    auVar31 = vshufps_avx(auVar31,auVar31,0xff);
    uVar58 = auVar28._0_4_;
    auVar70._4_4_ = uVar58;
    auVar70._0_4_ = uVar58;
    auVar70._8_4_ = uVar58;
    auVar70._12_4_ = uVar58;
    auVar22 = vshufps_avx512vl(auVar28,auVar28,0x55);
    auVar23 = vshufps_avx512vl(auVar28,auVar28,0xaa);
    auVar28 = vshufps_avx(auVar28,auVar28,0xff);
    auVar24 = vbroadcastss_avx512vl(auVar27);
    auVar25 = vshufps_avx512vl(auVar27,auVar27,0x55);
    auVar27 = vshufps_avx(auVar27,auVar27,0xaa);
    auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)fVar10));
    auVar24 = vmulps_avx512vl(auVar24,bezier_basis0._3740_16_);
    auVar25 = vmulps_avx512vl(auVar25,bezier_basis0._3740_16_);
    auVar27 = vmulps_avx512vl(auVar27,bezier_basis0._3740_16_);
    auVar26 = vmulps_avx512vl(auVar26,bezier_basis0._3740_16_);
    auVar24 = vfmadd231ps_avx512vl(auVar24,bezier_basis0._2584_16_,auVar70);
    auVar22 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._2584_16_,auVar22);
    auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._2584_16_,auVar23);
    auVar28 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._2584_16_,auVar28);
    auVar23 = vfmadd231ps_avx512vl(auVar24,bezier_basis0._1428_16_,auVar67);
    auVar29 = vfmadd231ps_avx512vl(auVar22,bezier_basis0._1428_16_,auVar29);
    auVar27 = vfmadd231ps_fma(auVar27,bezier_basis0._1428_16_,auVar30);
    auVar28 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._1428_16_,auVar31);
    auVar30 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._272_16_,auVar62);
    auVar29 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._272_16_,auVar61);
    auVar61 = vfmadd231ps_fma(auVar27,bezier_basis0._272_16_,auVar57);
    auVar22 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._272_16_,auVar65);
    auVar23 = vshufps_avx512vl(auVar30,auVar30,0xb1);
    auVar27 = vminps_avx512vl(auVar23,auVar30);
    auVar57 = vshufpd_avx(auVar27,auVar27,1);
    auVar57 = vminps_avx(auVar57,auVar27);
    auVar24 = vshufps_avx512vl(auVar29,auVar29,0xb1);
    auVar28 = vminps_avx512vl(auVar24,auVar29);
    auVar27 = vshufpd_avx(auVar28,auVar28,1);
    auVar27 = vminps_avx(auVar27,auVar28);
    auVar57 = vinsertps_avx(auVar57,auVar27,0x1c);
    auVar31 = vshufps_avx(auVar61,auVar61,0xb1);
    auVar27 = vminps_avx(auVar31,auVar61);
    auVar28 = vshufpd_avx(auVar27,auVar27,1);
    auVar27 = vminps_avx(auVar28,auVar27);
    auVar57 = vinsertps_avx(auVar57,auVar27,0x20);
    auVar28 = vmaxps_avx512vl(auVar23,auVar30);
    auVar27 = vshufpd_avx(auVar28,auVar28,1);
    auVar27 = vmaxps_avx(auVar27,auVar28);
    auVar29 = vmaxps_avx512vl(auVar24,auVar29);
    auVar28 = vshufpd_avx(auVar29,auVar29,1);
    auVar28 = vmaxps_avx(auVar28,auVar29);
    auVar27 = vinsertps_avx(auVar27,auVar28,0x1c);
    auVar28 = vmaxps_avx(auVar31,auVar61);
    auVar31 = vshufpd_avx(auVar28,auVar28,1);
    auVar28 = vmaxps_avx(auVar31,auVar28);
    auVar31._8_4_ = 0x7fffffff;
    auVar31._0_8_ = 0x7fffffff7fffffff;
    auVar31._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl(auVar22,auVar31);
    auVar27 = vinsertps_avx(auVar27,auVar28,0x20);
    auVar28 = vprolq_avx512vl(auVar31,0x20);
    auVar28 = vmaxps_avx(auVar28,auVar31);
    uVar58 = auVar28._0_4_;
    auVar61._4_4_ = uVar58;
    auVar61._0_4_ = uVar58;
    auVar61._8_4_ = uVar58;
    auVar61._12_4_ = uVar58;
    auVar28 = vshufps_avx(auVar28,auVar28,0xaa);
    auVar28 = vmaxps_avx(auVar28,auVar61);
  }
  else {
    if ((int)uVar2 < 1) {
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      auVar50._16_4_ = 0xff800000;
      auVar50._20_4_ = 0xff800000;
      auVar50._24_4_ = 0xff800000;
      auVar50._28_4_ = 0xff800000;
      auVar51 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar33 = auVar55;
      auVar35 = auVar55;
      auVar48 = auVar50;
      auVar49 = auVar50;
    }
    else {
      auVar32 = vpbroadcastd_avx512vl();
      auVar63._4_4_ = uVar58;
      auVar63._0_4_ = uVar58;
      auVar63._8_4_ = uVar58;
      auVar63._12_4_ = uVar58;
      auVar63._16_4_ = uVar58;
      auVar63._20_4_ = uVar58;
      auVar63._24_4_ = uVar58;
      auVar63._28_4_ = uVar58;
      auVar33 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar34 = vpermps_avx512vl(auVar33,ZEXT1632(auVar57));
      auVar35 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar36 = vpermps_avx512vl(auVar35,ZEXT1632(auVar57));
      auVar68._4_4_ = fVar9;
      auVar68._0_4_ = fVar9;
      auVar68._8_4_ = fVar9;
      auVar68._12_4_ = fVar9;
      auVar68._16_4_ = fVar9;
      auVar68._20_4_ = fVar9;
      auVar68._24_4_ = fVar9;
      auVar68._28_4_ = fVar9;
      auVar69._4_4_ = uVar64;
      auVar69._0_4_ = uVar64;
      auVar69._8_4_ = uVar64;
      auVar69._12_4_ = uVar64;
      auVar69._16_4_ = uVar64;
      auVar69._20_4_ = uVar64;
      auVar69._24_4_ = uVar64;
      auVar69._28_4_ = uVar64;
      auVar48 = ZEXT1632(auVar31);
      auVar37 = vpermps_avx512vl(auVar33,auVar48);
      auVar60._8_4_ = 3;
      auVar60._0_8_ = 0x300000003;
      auVar60._12_4_ = 3;
      auVar60._16_4_ = 3;
      auVar60._20_4_ = 3;
      auVar60._24_4_ = 3;
      auVar60._28_4_ = 3;
      auVar38 = vpermps_avx512vl(auVar35,auVar48);
      auVar54 = vpermps_avx2(auVar60,auVar48);
      auVar39 = vbroadcastss_avx512vl(auVar28);
      auVar48 = ZEXT1632(auVar28);
      auVar40 = vpermps_avx512vl(auVar33,auVar48);
      auVar41 = vpermps_avx512vl(auVar35,auVar48);
      auVar42 = vpermps_avx512vl(auVar60,auVar48);
      auVar43 = vbroadcastss_avx512vl(auVar27);
      auVar44 = vpermps_avx512vl(auVar33,ZEXT1632(auVar27));
      auVar45 = vpermps_avx512vl(auVar35,ZEXT1632(auVar27));
      auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)fVar10));
      lVar16 = uVar17 * 0x44;
      auVar53._8_4_ = 0xff800000;
      auVar53._0_8_ = 0xff800000ff800000;
      auVar53._12_4_ = 0xff800000;
      auVar53._16_4_ = 0xff800000;
      auVar53._20_4_ = 0xff800000;
      auVar53._24_4_ = 0xff800000;
      auVar53._28_4_ = 0xff800000;
      auVar66._8_4_ = 0x7f800000;
      auVar66._0_8_ = 0x7f8000007f800000;
      auVar66._12_4_ = 0x7f800000;
      auVar66._16_4_ = 0x7f800000;
      auVar66._20_4_ = 0x7f800000;
      auVar66._24_4_ = 0x7f800000;
      auVar66._28_4_ = 0x7f800000;
      auVar59 = ZEXT864(0) << 0x20;
      uVar20 = 0;
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar60 = auVar53;
      auVar13 = auVar53;
      auVar14 = auVar66;
      auVar15 = auVar66;
      do {
        auVar33 = vpbroadcastd_avx512vl();
        auVar33 = vpord_avx512vl(auVar33,_DAT_0205a920);
        uVar12 = vpcmpgtd_avx512vl(auVar32,auVar33);
        auVar33 = *(undefined1 (*) [32])(lVar16 + 0x2227bec + uVar20 * 4);
        auVar35 = *(undefined1 (*) [32])(lVar16 + 0x2228070 + uVar20 * 4);
        auVar48 = vmulps_avx512vl(auVar43,auVar35);
        auVar49 = vmulps_avx512vl(auVar44,auVar35);
        auVar50 = vmulps_avx512vl(auVar45,auVar35);
        auVar35 = vmulps_avx512vl(auVar46,auVar35);
        auVar48 = vfmadd231ps_avx512vl(auVar48,auVar33,auVar39);
        auVar49 = vfmadd231ps_avx512vl(auVar49,auVar33,auVar40);
        auVar50 = vfmadd231ps_avx512vl(auVar50,auVar33,auVar41);
        auVar35 = vfmadd231ps_avx512vl(auVar35,auVar42,auVar33);
        auVar33 = *(undefined1 (*) [32])(lVar16 + 0x2227768 + uVar20 * 4);
        auVar48 = vfmadd231ps_avx512vl(auVar48,auVar33,auVar69);
        auVar49 = vfmadd231ps_avx512vl(auVar49,auVar33,auVar37);
        auVar50 = vfmadd231ps_avx512vl(auVar50,auVar33,auVar38);
        auVar35 = vfmadd231ps_avx512vl(auVar35,auVar54,auVar33);
        auVar33 = *(undefined1 (*) [32])(bezier_basis0 + uVar20 * 4 + lVar16);
        auVar48 = vfmadd231ps_avx512vl(auVar48,auVar33,auVar63);
        auVar49 = vfmadd231ps_avx512vl(auVar49,auVar33,auVar34);
        auVar51 = vfmadd231ps_avx512vl(auVar50,auVar33,auVar36);
        auVar52 = vfmadd231ps_avx512vl(auVar35,auVar68,auVar33);
        auVar33 = vminps_avx512vl(auVar14,auVar48);
        bVar7 = (byte)uVar12;
        auVar55._0_4_ = (uint)(bVar7 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar14._0_4_
        ;
        bVar8 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar14._4_4_;
        bVar8 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar14._8_4_;
        bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar14._12_4_;
        bVar8 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar8 * auVar33._16_4_ | (uint)!bVar8 * auVar14._16_4_;
        bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar8 * auVar33._20_4_ | (uint)!bVar8 * auVar14._20_4_;
        bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar8 * auVar33._24_4_ | (uint)!bVar8 * auVar14._24_4_;
        bVar8 = SUB81(uVar12 >> 7,0);
        auVar55._28_4_ = (uint)bVar8 * auVar33._28_4_ | (uint)!bVar8 * auVar14._28_4_;
        auVar33 = vmaxps_avx512vl(auVar13,auVar48);
        auVar50._0_4_ = (uint)(bVar7 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar13._0_4_
        ;
        bVar8 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar8 * auVar33._4_4_ | (uint)!bVar8 * auVar13._4_4_;
        bVar8 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar8 * auVar33._8_4_ | (uint)!bVar8 * auVar13._8_4_;
        bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar8 * auVar33._12_4_ | (uint)!bVar8 * auVar13._12_4_;
        bVar8 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar50._16_4_ = (uint)bVar8 * auVar33._16_4_ | (uint)!bVar8 * auVar13._16_4_;
        bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar50._20_4_ = (uint)bVar8 * auVar33._20_4_ | (uint)!bVar8 * auVar13._20_4_;
        bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar50._24_4_ = (uint)bVar8 * auVar33._24_4_ | (uint)!bVar8 * auVar13._24_4_;
        bVar8 = SUB81(uVar12 >> 7,0);
        auVar50._28_4_ = (uint)bVar8 * auVar33._28_4_ | (uint)!bVar8 * auVar13._28_4_;
        auVar35 = vminps_avx512vl(auVar15,auVar49);
        auVar33._0_4_ = (uint)(bVar7 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar15._0_4_
        ;
        bVar8 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar33._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar15._4_4_;
        bVar8 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar33._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar15._8_4_;
        bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar33._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar15._12_4_;
        bVar8 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar33._16_4_ = (uint)bVar8 * auVar35._16_4_ | (uint)!bVar8 * auVar15._16_4_;
        bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar33._20_4_ = (uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * auVar15._20_4_;
        bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar33._24_4_ = (uint)bVar8 * auVar35._24_4_ | (uint)!bVar8 * auVar15._24_4_;
        bVar8 = SUB81(uVar12 >> 7,0);
        auVar33._28_4_ = (uint)bVar8 * auVar35._28_4_ | (uint)!bVar8 * auVar15._28_4_;
        auVar35 = vmaxps_avx512vl(auVar60,auVar49);
        auVar48._0_4_ = (uint)(bVar7 & 1) * auVar35._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar60._0_4_
        ;
        bVar8 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar8 * auVar35._4_4_ | (uint)!bVar8 * auVar60._4_4_;
        bVar8 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar8 * auVar35._8_4_ | (uint)!bVar8 * auVar60._8_4_;
        bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar8 * auVar35._12_4_ | (uint)!bVar8 * auVar60._12_4_;
        bVar8 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar8 * auVar35._16_4_ | (uint)!bVar8 * auVar60._16_4_;
        bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar8 * auVar35._20_4_ | (uint)!bVar8 * auVar60._20_4_;
        bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar8 * auVar35._24_4_ | (uint)!bVar8 * auVar60._24_4_;
        bVar8 = SUB81(uVar12 >> 7,0);
        auVar48._28_4_ = (uint)bVar8 * auVar35._28_4_ | (uint)!bVar8 * auVar60._28_4_;
        auVar49 = vminps_avx512vl(auVar66,auVar51);
        auVar35._0_4_ = (uint)(bVar7 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar66._0_4_
        ;
        bVar8 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar8 * auVar49._4_4_ | (uint)!bVar8 * auVar66._4_4_;
        bVar8 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar8 * auVar49._8_4_ | (uint)!bVar8 * auVar66._8_4_;
        bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar8 * auVar49._12_4_ | (uint)!bVar8 * auVar66._12_4_;
        bVar8 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar35._16_4_ = (uint)bVar8 * auVar49._16_4_ | (uint)!bVar8 * auVar66._16_4_;
        bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar35._20_4_ = (uint)bVar8 * auVar49._20_4_ | (uint)!bVar8 * auVar66._20_4_;
        bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar35._24_4_ = (uint)bVar8 * auVar49._24_4_ | (uint)!bVar8 * auVar66._24_4_;
        bVar8 = SUB81(uVar12 >> 7,0);
        auVar35._28_4_ = (uint)bVar8 * auVar49._28_4_ | (uint)!bVar8 * auVar66._28_4_;
        auVar51 = vmaxps_avx512vl(auVar53,auVar51);
        auVar49._0_4_ = (uint)(bVar7 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar53._0_4_
        ;
        bVar8 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar49._4_4_ = (uint)bVar8 * auVar51._4_4_ | (uint)!bVar8 * auVar53._4_4_;
        bVar8 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar49._8_4_ = (uint)bVar8 * auVar51._8_4_ | (uint)!bVar8 * auVar53._8_4_;
        bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar49._12_4_ = (uint)bVar8 * auVar51._12_4_ | (uint)!bVar8 * auVar53._12_4_;
        bVar8 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar49._16_4_ = (uint)bVar8 * auVar51._16_4_ | (uint)!bVar8 * auVar53._16_4_;
        bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar49._20_4_ = (uint)bVar8 * auVar51._20_4_ | (uint)!bVar8 * auVar53._20_4_;
        bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar49._24_4_ = (uint)bVar8 * auVar51._24_4_ | (uint)!bVar8 * auVar53._24_4_;
        bVar8 = SUB81(uVar12 >> 7,0);
        auVar49._28_4_ = (uint)bVar8 * auVar51._28_4_ | (uint)!bVar8 * auVar53._28_4_;
        vandps_avx512vl(auVar52,auVar47);
        auVar53 = vmaxps_avx512vl(auVar59._0_32_,auVar49);
        auVar51._0_4_ = (uint)(bVar7 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar59._0_4_
        ;
        bVar8 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar8 * auVar53._4_4_ | (uint)!bVar8 * auVar59._4_4_;
        bVar8 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar8 * auVar53._8_4_ | (uint)!bVar8 * auVar59._8_4_;
        bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar8 * auVar53._12_4_ | (uint)!bVar8 * auVar59._12_4_;
        bVar8 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar8 * auVar53._16_4_ | (uint)!bVar8 * auVar59._16_4_;
        bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar8 * auVar53._20_4_ | (uint)!bVar8 * auVar59._20_4_;
        bVar8 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar8 * auVar53._24_4_ | (uint)!bVar8 * auVar59._24_4_;
        bVar8 = SUB81(uVar12 >> 7,0);
        auVar51._28_4_ = (uint)bVar8 * auVar53._28_4_ | (uint)!bVar8 * auVar59._28_4_;
        auVar59 = ZEXT3264(auVar51);
        uVar20 = uVar20 + 8;
        auVar53 = auVar49;
        auVar60 = auVar48;
        auVar13 = auVar50;
        auVar66 = auVar35;
        auVar14 = auVar55;
        auVar15 = auVar33;
      } while (uVar20 < uVar17);
    }
    auVar54 = vshufps_avx512vl(auVar55,auVar55,0xb1);
    auVar54 = vminps_avx512vl(auVar55,auVar54);
    auVar55 = vshufpd_avx(auVar54,auVar54,5);
    auVar55 = vminps_avx(auVar54,auVar55);
    auVar57 = vminps_avx(auVar55._0_16_,auVar55._16_16_);
    auVar55 = vshufps_avx512vl(auVar33,auVar33,0xb1);
    auVar55 = vminps_avx512vl(auVar33,auVar55);
    auVar33 = vshufpd_avx(auVar55,auVar55,5);
    auVar33 = vminps_avx(auVar55,auVar33);
    auVar27 = vminps_avx(auVar33._0_16_,auVar33._16_16_);
    auVar27 = vunpcklps_avx(auVar57,auVar27);
    auVar33 = vshufps_avx(auVar35,auVar35,0xb1);
    auVar33 = vminps_avx(auVar35,auVar33);
    auVar35 = vshufpd_avx(auVar33,auVar33,5);
    auVar33 = vminps_avx(auVar33,auVar35);
    auVar57 = vminps_avx(auVar33._0_16_,auVar33._16_16_);
    auVar57 = vinsertps_avx(auVar27,auVar57,0x28);
    auVar33 = vshufps_avx(auVar50,auVar50,0xb1);
    auVar33 = vmaxps_avx(auVar50,auVar33);
    auVar35 = vshufpd_avx(auVar33,auVar33,5);
    auVar33 = vmaxps_avx(auVar33,auVar35);
    auVar27 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
    auVar33 = vshufps_avx(auVar48,auVar48,0xb1);
    auVar33 = vmaxps_avx(auVar48,auVar33);
    auVar35 = vshufpd_avx(auVar33,auVar33,5);
    auVar33 = vmaxps_avx(auVar33,auVar35);
    auVar28 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
    auVar28 = vunpcklps_avx(auVar27,auVar28);
    auVar33 = vshufps_avx(auVar49,auVar49,0xb1);
    auVar33 = vmaxps_avx(auVar49,auVar33);
    auVar35 = vshufpd_avx(auVar33,auVar33,5);
    auVar33 = vmaxps_avx(auVar33,auVar35);
    auVar27 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
    auVar27 = vinsertps_avx(auVar28,auVar27,0x28);
    auVar33 = vshufps_avx(auVar51,auVar51,0xb1);
    auVar33 = vmaxps_avx(auVar51,auVar33);
    auVar35 = vshufpd_avx(auVar33,auVar33,5);
    auVar33 = vmaxps_avx(auVar33,auVar35);
    auVar28 = vmaxps_avx(auVar33._0_16_,auVar33._16_16_);
    auVar28._4_4_ = auVar28._0_4_;
    auVar28._8_4_ = auVar28._0_4_;
    auVar28._12_4_ = auVar28._0_4_;
  }
  auVar31 = vminps_avx(auVar57,auVar56);
  auVar57 = vmaxps_avx(auVar27,auVar56);
  auVar56._4_4_ = fVar10;
  auVar56._0_4_ = fVar10;
  auVar56._8_4_ = fVar10;
  auVar56._12_4_ = fVar10;
  auVar27._8_4_ = 0x7fffffff;
  auVar27._0_8_ = 0x7fffffff7fffffff;
  auVar27._12_4_ = 0x7fffffff;
  auVar27 = vandps_avx512vl(auVar56,auVar27);
  auVar27 = vmaxps_avx(auVar28,auVar27);
  auVar28 = vsubps_avx(auVar31,auVar27);
  auVar30._0_4_ = auVar57._0_4_ + auVar27._0_4_;
  auVar30._4_4_ = auVar57._4_4_ + auVar27._4_4_;
  auVar30._8_4_ = auVar57._8_4_ + auVar27._8_4_;
  auVar30._12_4_ = auVar57._12_4_ + auVar27._12_4_;
  auVar22._8_4_ = 0x7fffffff;
  auVar22._0_8_ = 0x7fffffff7fffffff;
  auVar22._12_4_ = 0x7fffffff;
  auVar57 = vandps_avx(auVar28,auVar22);
  auVar27 = vandps_avx(auVar30,auVar22);
  auVar57 = vmaxps_avx(auVar57,auVar27);
  auVar27 = vmovshdup_avx(auVar57);
  auVar27 = vmaxss_avx(auVar27,auVar57);
  auVar57 = vshufpd_avx(auVar57,auVar57,1);
  auVar57 = vmaxss_avx(auVar57,auVar27);
  fVar1 = auVar57._0_4_ * 4.7683716e-07;
  auVar57._4_4_ = fVar1;
  auVar57._0_4_ = fVar1;
  auVar57._8_4_ = fVar1;
  auVar57._12_4_ = fVar1;
  aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar28,auVar57);
  (__return_storage_ptr__->lower).field_0 = aVar11;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar30._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar30._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar30._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar30._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }